

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_terminator.h
# Opt level: O0

int __thiscall
PlayerTerminator::move(PlayerTerminator *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  PlayerCopy *pPVar5;
  vector<Move,_std::allocator<Move>_> *moveHistory_00;
  vector<Move,_std::allocator<Move>_> *pvVar6;
  vector<Move,_std::allocator<Move>_> *in_RSI;
  Move *playedMove;
  int predictedMoveCycle_3;
  int predictedMoveCopy;
  int predictedMoveNext;
  int predictedMoveDelay_2;
  int predictedMoveDelay;
  size_t i;
  uint correctCycle_3;
  uint correctCopy;
  uint correctNext;
  uint correctDelay_2;
  uint correctDelay;
  vector<Move,_std::allocator<Move>_> invertedMoveHistory;
  PlayerCycle_3 cycle_3;
  PlayerCopy copy;
  PlayerNext next;
  PlayerDelay_2 delay_2;
  PlayerDelay delay;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  PlayerCycle_3 *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  PlayerCopy *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  vector<Move,_std::allocator<Move>_> *in_stack_fffffffffffffd60;
  Move local_230;
  const_reference local_228;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  ulong local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  allocator local_1c9;
  string local_1c8 [87];
  allocator local_171;
  string local_170 [87];
  allocator local_119;
  string local_118 [87];
  allocator local_c1;
  string local_c0 [95];
  allocator local_61;
  string local_60 [72];
  vector<Move,_std::allocator<Move>_> *local_18;
  int local_4;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"terminator",&local_61);
  PlayerDelay::PlayerDelay
            ((PlayerDelay *)in_stack_fffffffffffffd30,
             (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"terminator",&local_c1);
  PlayerDelay_2::PlayerDelay_2
            ((PlayerDelay_2 *)in_stack_fffffffffffffd30,
             (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"terminator",&local_119);
  PlayerNext::PlayerNext
            ((PlayerNext *)in_stack_fffffffffffffd40,
             (string *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"terminator",&local_171);
  PlayerCopy::PlayerCopy
            (in_stack_fffffffffffffd40,
             (string *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"terminator",&local_1c9);
  PlayerCycle_3::PlayerCycle_3
            (in_stack_fffffffffffffd30,
             (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::vector<Move,_std::allocator<Move>_>::vector((vector<Move,_std::allocator<Move>_> *)0x10bb4b);
  std::vector<Move,_std::allocator<Move>_>::size(local_18);
  std::vector<Move,_std::allocator<Move>_>::reserve
            (in_stack_fffffffffffffd60,CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
            );
  local_1ec = 0;
  local_1f0 = 0;
  local_1f4 = 0;
  local_1f8 = 0;
  local_1fc = 0;
  local_208 = 0;
  while( true ) {
    uVar4 = local_208;
    sVar3 = std::vector<Move,_std::allocator<Move>_>::size(local_18);
    if (sVar3 <= uVar4) break;
    local_20c = PlayerDelay::move((PlayerDelay *)
                                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                  (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30);
    local_210 = PlayerDelay_2::move((PlayerDelay_2 *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                    (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30
                                   );
    local_214 = PlayerNext::move((PlayerNext *)
                                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                 (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30);
    local_218 = PlayerCopy::move((PlayerCopy *)
                                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                 (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30);
    local_21c = PlayerCycle_3::move(in_stack_fffffffffffffd30,
                                    (vector<Move,_std::allocator<Move>_> *)
                                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_228 = std::vector<Move,_std::allocator<Move>_>::operator[](local_18,local_208);
    if (local_20c == local_228->m_you) {
      local_1ec = local_1ec + 1;
    }
    if (local_210 == local_228->m_you) {
      local_1f0 = local_1f0 + 1;
    }
    if (local_214 == local_228->m_you) {
      local_1f4 = local_1f4 + 1;
    }
    if (local_218 == local_228->m_you) {
      local_1f8 = local_1f8 + 1;
    }
    if (local_21c == local_228->m_you) {
      local_1fc = local_1fc + 1;
    }
    Move::Move(&local_230,local_228->m_you,local_228->m_me);
    std::vector<Move,_std::allocator<Move>_>::push_back
              ((vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30,
               (value_type *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_208 = local_208 + 1;
  }
  uVar1 = local_1fc << 1;
  sVar3 = std::vector<Move,_std::allocator<Move>_>::size(local_18);
  if (sVar3 < uVar1) {
    iVar2 = PlayerCycle_3::move(in_stack_fffffffffffffd30,
                                (vector<Move,_std::allocator<Move>_> *)
                                CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_4 = beats(iVar2);
  }
  else {
    uVar4 = (ulong)(uint)(local_1f4 << 1);
    sVar3 = std::vector<Move,_std::allocator<Move>_>::size(local_18);
    if (sVar3 < uVar4) {
      iVar2 = PlayerNext::move((PlayerNext *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                               (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30);
      local_4 = beats(iVar2);
    }
    else {
      uVar1 = local_1f0 << 1;
      sVar3 = std::vector<Move,_std::allocator<Move>_>::size(local_18);
      if (sVar3 < uVar1) {
        iVar2 = PlayerDelay_2::move((PlayerDelay_2 *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                    (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30
                                   );
        local_4 = beats(iVar2);
      }
      else {
        in_stack_fffffffffffffd40 = (PlayerCopy *)(ulong)(uint)(local_1ec << 1);
        pPVar5 = (PlayerCopy *)std::vector<Move,_std::allocator<Move>_>::size(local_18);
        if (pPVar5 < in_stack_fffffffffffffd40) {
          iVar2 = PlayerDelay::move((PlayerDelay *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                    (vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd30
                                   );
          local_4 = beats(iVar2);
        }
        else {
          moveHistory_00 = (vector<Move,_std::allocator<Move>_> *)(ulong)(uint)(local_1f8 << 1);
          pvVar6 = (vector<Move,_std::allocator<Move>_> *)
                   std::vector<Move,_std::allocator<Move>_>::size(local_18);
          if (pvVar6 < moveHistory_00) {
            iVar2 = PlayerCopy::move((PlayerCopy *)
                                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                     moveHistory_00);
            local_4 = beats(iVar2);
          }
          else {
            local_4 = PlayerDelay::move((PlayerDelay *)
                                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ),moveHistory_00);
          }
        }
      }
    }
  }
  std::vector<Move,_std::allocator<Move>_>::~vector
            ((vector<Move,_std::allocator<Move>_> *)in_stack_fffffffffffffd40);
  PlayerCycle_3::~PlayerCycle_3((PlayerCycle_3 *)0x10c1c1);
  PlayerCopy::~PlayerCopy((PlayerCopy *)0x10c1ce);
  PlayerNext::~PlayerNext((PlayerNext *)0x10c1db);
  PlayerDelay_2::~PlayerDelay_2((PlayerDelay_2 *)0x10c1e8);
  PlayerDelay::~PlayerDelay((PlayerDelay *)0x10c1f5);
  return local_4;
}

Assistant:

int move(const std::vector<Move>& moveHistory)
   {
      PlayerDelay   delay("terminator");
      PlayerDelay_2 delay_2("terminator");
      PlayerNext    next("terminator", 0);
      PlayerCopy    copy("terminator", 0);
      PlayerCycle_3 cycle_3("terminator");

      // Loop over all the moves played so far, and count the number of times
      // the move played by the opponent matches that predicted by our local
      // instantiation of DELAY.
      std::vector<Move> invertedMoveHistory;
      invertedMoveHistory.reserve(moveHistory.size());   // Optimization
      unsigned int correctDelay   = 0;
      unsigned int correctDelay_2 = 0;
      unsigned int correctNext    = 0;
      unsigned int correctCopy    = 0;
      unsigned int correctCycle_3 = 0;
      for (size_t i=0; i<moveHistory.size(); ++i)
      {
         const int predictedMoveDelay   = delay.move(invertedMoveHistory);
         const int predictedMoveDelay_2 = delay_2.move(invertedMoveHistory);
         const int predictedMoveNext    = next.move(invertedMoveHistory);
         const int predictedMoveCopy    = copy.move(invertedMoveHistory);
         const int predictedMoveCycle_3 = cycle_3.move(invertedMoveHistory);
         const Move& playedMove = moveHistory[i];

         if (predictedMoveDelay == playedMove.m_you)
         {
            correctDelay += 1;
         }
         if (predictedMoveDelay_2 == playedMove.m_you)
         {
            correctDelay_2 += 1;
         }
         if (predictedMoveNext == playedMove.m_you)
         {
            correctNext += 1;
         }
         if (predictedMoveCopy == playedMove.m_you)
         {
            correctCopy += 1;
         }
         if (predictedMoveCycle_3 == playedMove.m_you)
         {
            correctCycle_3 += 1;
         }

         // Update moveHistory with the inverted moves (i.e. as seen by the
         // opponent).
         invertedMoveHistory.push_back(Move(playedMove.m_you, playedMove.m_me));
      }

#ifdef DEBUG
      std::cout << (correctDelay*100.0) / moveHistory.size() << "  " << std::endl;
#endif

      // Determine if the noves played by our opponent matches that of DELAY.
      // If so, play whatever beats DELAY. Otherwise, just copy DELAY's strategy.
      if (correctCycle_3*2 > moveHistory.size())
         return beats(cycle_3.move(invertedMoveHistory));
      else if (correctNext*2 > moveHistory.size())
         return beats(next.move(invertedMoveHistory));
      else if (correctDelay_2*2 > moveHistory.size())
         return beats(delay_2.move(invertedMoveHistory));
      else if (correctDelay*2 > moveHistory.size())
         return beats(delay.move(invertedMoveHistory));
      else if (correctCopy*2 > moveHistory.size())
         return beats(copy.move(invertedMoveHistory));
      else
         return delay.move(moveHistory);

   }